

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_callback.hpp
# Opt level: O1

void __thiscall
asio::ssl::detail::verify_callback<asio::ssl::rfc2818_verification>::~verify_callback
          (verify_callback<asio::ssl::rfc2818_verification> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_verify_callback_base)._vptr_verify_callback_base =
       (_func_int **)&PTR__verify_callback_002524e8;
  pcVar2 = (this->callback_).host_._M_dataplus._M_p;
  paVar1 = &(this->callback_).host_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit verify_callback(VerifyCallback callback)
    : callback_(callback)
  {
  }